

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O1

int archive_write_pax_header_xattrs(archive_write *a,pax *pax,archive_entry *entry)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  char *p;
  char *pcVar4;
  size_t value_len;
  char *value_00;
  wchar_t wVar5;
  wchar_t wVar6;
  int iVar7;
  byte *pbVar8;
  byte *__s;
  char *__s_00;
  char *pcVar9;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  byte *pbVar14;
  int iVar15;
  bool bVar16;
  size_t size;
  void *value;
  char *name;
  archive_string local_88;
  archive_string *local_68;
  archive_write *local_60;
  archive_string *local_58;
  archive_entry *local_50;
  size_t local_48;
  char *local_40;
  byte *local_38;
  
  local_60 = a;
  local_50 = entry;
  wVar5 = archive_entry_xattr_reset(entry);
  local_58 = &pax->l_url_encoded_name;
  local_68 = &pax->pax_header;
  do {
    bVar16 = wVar5 == L'\0';
    wVar5 = wVar5 + L'\xffffffff';
    if (bVar16) {
      return 0;
    }
    archive_entry_xattr_next(local_50,(char **)&local_38,&local_40,&local_48);
    pbVar14 = local_38;
    bVar1 = *local_38;
    if (bVar1 == 0) {
      sVar13 = 1;
    }
    else {
      uVar12 = 0;
      bVar10 = bVar1;
      pbVar8 = local_38;
      do {
        pbVar8 = pbVar8 + 1;
        if (((((char)bVar10 < '!') || (bVar10 == 0x25)) || (bVar10 == 0x7f)) || (bVar10 == 0x3d)) {
          lVar11 = 3;
          if (0xfffffffffffffffb < uVar12) goto LAB_0073bae1;
        }
        else {
          lVar11 = 1;
          if (0xfffffffffffffffd < uVar12) goto LAB_0073bae1;
        }
        uVar12 = uVar12 + lVar11;
        bVar10 = *pbVar8;
      } while (bVar10 != 0);
      sVar13 = uVar12 + 1;
    }
    __s = (byte *)malloc(sVar13);
    pbVar8 = __s;
    if (__s == (byte *)0x0) {
LAB_0073bae1:
      __s = (byte *)0x0;
    }
    else {
      while (bVar1 != 0) {
        pbVar14 = pbVar14 + 1;
        if ((((char)bVar1 < '!') || (bVar1 == 0x25)) || ((bVar1 == 0x7f || (bVar1 == 0x3d)))) {
          *pbVar8 = 0x25;
          pbVar8[1] = "0123456789ABCDEF"[bVar1 >> 4];
          pbVar8[2] = "0123456789ABCDEF"[bVar1 & 0xf];
          pbVar8 = pbVar8 + 3;
        }
        else {
          *pbVar8 = bVar1;
          pbVar8 = pbVar8 + 1;
        }
        bVar1 = *pbVar14;
      }
      *pbVar8 = 0;
    }
    iVar15 = 4;
    if (__s != (byte *)0x0) {
      sVar13 = strlen((char *)__s);
      wVar6 = archive_strncpy_l(local_58,__s,sVar13,pax->sconv_utf8);
      free(__s);
      value_00 = local_40;
      value_len = local_48;
      if (wVar6 != L'\xffffffff') {
        if (wVar6 == L'\0') {
          p = local_58->s;
          if (p != (char *)0x0) {
            if ((pax->flags & 2) != 0) {
              __s_00 = (char *)malloc((local_48 * 4 + 2) / 3 + 1);
              pcVar9 = __s_00;
              uVar12 = value_len;
              pcVar4 = value_00;
              if (__s_00 == (char *)0x0) {
                __s_00 = (char *)0x0;
              }
              else {
                for (; 2 < uVar12; uVar12 = uVar12 - 3) {
                  cVar2 = *pcVar4;
                  cVar3 = pcVar4[1];
                  bVar1 = pcVar4[2];
                  *pcVar9 = base64_encode_digits[(uint)(int)cVar2 >> 2 & 0x3f];
                  pcVar9[1] = base64_encode_digits
                              [(((int)cVar3 & 0xf0U) << 8 | ((int)cVar2 & 3U) << 0x10) >> 0xc];
                  pcVar9[2] = base64_encode_digits[(uint)(int)CONCAT11(cVar3,bVar1) >> 6 & 0x3f];
                  pcVar9[3] = base64_encode_digits[bVar1 & 0x3f];
                  pcVar9 = pcVar9 + 4;
                  pcVar4 = pcVar4 + 3;
                }
                if (uVar12 == 2) {
                  cVar2 = *pcVar4;
                  cVar3 = pcVar4[1];
                  *pcVar9 = base64_encode_digits[(uint)(int)cVar2 >> 2 & 0x3f];
                  pcVar9[1] = base64_encode_digits
                              [(((int)cVar3 & 0xf0U) << 8 | ((int)cVar2 & 3U) << 0x10) >> 0xc];
                  pcVar9[2] = base64_encode_digits[(ulong)((int)cVar3 & 0xf) * 4];
                  pcVar9 = pcVar9 + 3;
                }
                else if (uVar12 == 1) {
                  cVar2 = *pcVar4;
                  *pcVar9 = base64_encode_digits[(uint)(int)cVar2 >> 2 & 0x3f];
                  pcVar9[1] = base64_encode_digits[((int)cVar2 & 3U) << 4];
                  pcVar9 = pcVar9 + 2;
                }
                *pcVar9 = '\0';
              }
              if (__s_00 != (char *)0x0) {
                local_88.s = (char *)0x0;
                local_88.length = 0;
                local_88.buffer_length = 0;
                archive_strncat(&local_88,"LIBARCHIVE.xattr.",0x11);
                archive_strcat(&local_88,p);
                pcVar9 = local_88.s;
                sVar13 = strlen(__s_00);
                add_pax_attr_binary(local_68,pcVar9,__s_00,sVar13);
                archive_string_free(&local_88);
              }
              free(__s_00);
            }
            if ((pax->flags & 1) != 0) {
              local_88.s = (char *)0x0;
              local_88.length = 0;
              local_88.buffer_length = 0;
              archive_strncat(&local_88,"SCHILY.xattr.",0xd);
              archive_strcat(&local_88,p);
              add_pax_attr_binary(local_68,local_88.s,value_00,value_len);
              archive_string_free(&local_88);
            }
          }
          iVar15 = 0;
        }
        else {
          archive_set_error(&local_60->archive,-1,"Error encoding pax extended attribute");
          iVar15 = 1;
        }
      }
    }
    if (iVar15 != 0) {
      iVar7 = -0x19;
      if (iVar15 == 4) {
        archive_set_error(&local_60->archive,0xc,"Can\'t allocate memory");
        iVar7 = -0x1e;
      }
      return iVar7;
    }
  } while( true );
}

Assistant:

static int
archive_write_pax_header_xattrs(struct archive_write *a,
    struct pax *pax, struct archive_entry *entry)
{
	int i = archive_entry_xattr_reset(entry);

	while (i--) {
		const char *name;
		const void *value;
		char *url_encoded_name = NULL, *encoded_name = NULL;
		size_t size;
		int r;

		archive_entry_xattr_next(entry, &name, &value, &size);
		url_encoded_name = url_encode(name);
		if (url_encoded_name == NULL)
			goto malloc_error;
		else {
			/* Convert narrow-character to UTF-8. */
			r = archive_strcpy_l(&(pax->l_url_encoded_name),
			    url_encoded_name, pax->sconv_utf8);
			free(url_encoded_name); /* Done with this. */
			if (r == 0)
				encoded_name = pax->l_url_encoded_name.s;
			else if (r == -1)
				goto malloc_error;
			else {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Error encoding pax extended attribute");
				return (ARCHIVE_FAILED);
			}
		}

		archive_write_pax_header_xattr(pax, encoded_name,
		    value, size);

	}
	return (ARCHIVE_OK);
malloc_error:
	archive_set_error(&a->archive, ENOMEM, "Can't allocate memory");
	return (ARCHIVE_FATAL);
}